

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

ArrowTypeExtension *
duckdb::GetArrowExtensionInternal
          (ArrowTypeExtension *__return_storage_ptr__,
          unordered_map<duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension,_duckdb::HashArrowTypeExtension,_std::equal_to<duckdb::ArrowExtensionMetadata>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>_>
          *type_extensions,ArrowExtensionMetadata *info)

{
  iterator iVar1;
  mapped_type *pmVar2;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> type;
  string format;
  ArrowExtensionMetadata og_info;
  undefined1 local_f0 [48];
  string local_c0 [32];
  undefined1 local_a0 [128];
  
  iVar1 = ::std::
          _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&type_extensions->_M_h,info);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
      ._M_cur == (__node_type *)0x0) {
    ArrowExtensionMetadata::ArrowExtensionMetadata((ArrowExtensionMetadata *)local_a0,info);
    ::std::__cxx11::string::string
              (local_c0,anon_var_dwarf_4b71df5 + 9,(allocator *)(local_f0 + 0x10));
    ::std::__cxx11::string::operator=((string *)&info->arrow_format,local_c0);
    ::std::__cxx11::string::~string(local_c0);
    iVar1 = ::std::
            _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&type_extensions->_M_h,info);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
        ._M_cur == (__node_type *)0x0) {
      ::std::__cxx11::string::string((string *)(local_f0 + 0x10),(string *)(local_a0 + 0x60));
      ArrowType::GetTypeFromFormat((ArrowType *)local_f0,(string *)(local_f0 + 0x10));
      local_f0._8_8_ = local_f0._0_8_;
      local_f0._0_8_ =
           (__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)0x0;
      ArrowTypeExtension::ArrowTypeExtension
                (__return_storage_ptr__,(ArrowExtensionMetadata *)local_a0,
                 (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 (local_f0 + 8));
      ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                 (local_f0 + 8));
      ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)local_f0)
      ;
      ::std::__cxx11::string::~string((string *)(local_f0 + 0x10));
      ArrowExtensionMetadata::~ArrowExtensionMetadata((ArrowExtensionMetadata *)local_a0);
      return __return_storage_ptr__;
    }
    ArrowExtensionMetadata::~ArrowExtensionMetadata((ArrowExtensionMetadata *)local_a0);
  }
  pmVar2 = ::std::__detail::
           _Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)type_extensions,info);
  ArrowTypeExtension::ArrowTypeExtension(__return_storage_ptr__,pmVar2);
  return __return_storage_ptr__;
}

Assistant:

ArrowTypeExtension GetArrowExtensionInternal(
    unordered_map<ArrowExtensionMetadata, ArrowTypeExtension, HashArrowTypeExtension> &type_extensions,
    ArrowExtensionMetadata info) {
	if (type_extensions.find(info) == type_extensions.end()) {
		auto og_info = info;
		info.SetArrowFormat("");
		if (type_extensions.find(info) == type_extensions.end()) {
			auto format = og_info.GetArrowFormat();
			auto type = ArrowType::GetTypeFromFormat(format);
			return ArrowTypeExtension(og_info, std::move(type));
		}
	}
	return type_extensions[info];
}